

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

void __thiscall GameEngine::calculateCells(GameEngine *this)

{
  Map *this_00;
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  int32_t carnivore;
  int32_t iVar4;
  int32_t iVar5;
  TypeName TVar6;
  int32_t iVar7;
  iterator iVar8;
  iterator iVar9;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *pvVar10;
  pointer psVar11;
  int32_t herbivore;
  shared_ptr<CellType> *cell;
  pointer psVar12;
  shared_ptr<Population> *population;
  pointer psVar13;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *row;
  shared_ptr<Player> *player;
  
  this_00 = (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar8 = Map::begin(this_00);
  iVar9 = Map::end(this_00);
  for (; iVar8._M_current != iVar9._M_current; iVar8._M_current = iVar8._M_current + 1) {
    psVar1 = ((iVar8._M_current)->
             super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar12 = ((iVar8._M_current)->
                   super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar1;
        psVar12 = psVar12 + 1) {
      CellType::setHerbivoreCount
                ((psVar12->super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0);
      CellType::setCarnivoreCount
                ((psVar12->super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0);
    }
  }
  psVar2 = (this->players).
           super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar11 = (this->players).
                 super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar11 != psVar2; psVar11 = psVar11 + 1
      ) {
    pvVar10 = Player::GetPlayerPopulations
                        ((psVar11->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    psVar3 = (pvVar10->
             super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar13 = (pvVar10->
                   super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar3;
        psVar13 = psVar13 + 1) {
      iVar4 = Population::GetXPos((psVar13->
                                  super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                                 );
      iVar5 = Population::GetYPos((psVar13->
                                  super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                                 );
      TVar6 = Population::GetType((psVar13->
                                  super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                                 );
      iVar7 = Population::GetAnimalAmount
                        ((psVar13->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      herbivore = 0;
      carnivore = iVar7;
      if (TVar6 != CARNIVORE) {
        carnivore = herbivore;
        herbivore = iVar7;
      }
      calculateCell(this,(long)iVar4,(long)iVar5,carnivore,herbivore);
    }
  }
  return;
}

Assistant:

void GameEngine::calculateCells() {
  for (auto &row : *map) {
    for (auto &cell : row) {
      cell->setHerbivoreCount(0);
      cell->setCarnivoreCount(0);
    }
  }

  for (const auto &player : players) {
    for (const auto &population : player->GetPlayerPopulations()) {
      int32_t xPos = population->GetXPos();
      int32_t yPos = population->GetYPos();

      int32_t herbivore = 0, carnivore = 0;

      if (population->GetType() == Population::TypeName::CARNIVORE) {
        carnivore += population->GetAnimalAmount();
      } else {
        herbivore += population->GetAnimalAmount();
      }

      calculateCell(xPos, yPos, carnivore, herbivore);
    }
  }
}